

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

Nullable<const_crc_internal::CrcCordState_*> __thiscall
absl::lts_20240722::Cord::MaybeGetCrcCordState(Cord *this)

{
  Nullable<absl::cord_internal::CordRep_*> pCVar1;
  CordRepCrc *pCVar2;
  Nullable<const_crc_internal::CrcCordState_*> pCVar3;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    return (Nullable<const_crc_internal::CrcCordState_*>)0x0;
  }
  pCVar1 = InlineRep::tree(&this->contents_);
  if (pCVar1->tag == '\x02') {
    pCVar1 = InlineRep::tree(&this->contents_);
    pCVar2 = cord_internal::CordRep::crc(pCVar1);
    pCVar3 = &pCVar2->crc_cord_state;
  }
  else {
    pCVar3 = (Nullable<const_crc_internal::CrcCordState_*>)0x0;
  }
  return pCVar3;
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }